

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int accessPayloadChecked(BtCursor *pCur,u32 offset,u32 amt,void *pBuf)

{
  int iVar1;
  
  if (pCur->eState == '\0') {
    iVar1 = 4;
  }
  else {
    iVar1 = btreeRestoreCursorPosition(pCur);
    if (iVar1 == 0) {
      iVar1 = accessPayload(pCur,offset,amt,(uchar *)pBuf,0);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static SQLITE_NOINLINE int accessPayloadChecked(
  BtCursor *pCur,
  u32 offset,
  u32 amt,
  void *pBuf
){
  int rc;
  if ( pCur->eState==CURSOR_INVALID ){
    return SQLITE_ABORT;
  }
  assert( cursorOwnsBtShared(pCur) );
  rc = btreeRestoreCursorPosition(pCur);
  return rc ? rc : accessPayload(pCur, offset, amt, pBuf, 0);
}